

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat.cpp
# Opt level: O0

void __thiscall
ncnn::Mat::create(Mat *this,int _w,int _h,int _d,int _c,size_t _elemsize,int _elempack,
                 Allocator *_allocator)

{
  int *piVar1;
  int iVar2;
  ulong uVar3;
  long lVar4;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  long *in_RDI;
  int in_R8D;
  long in_R9;
  int in_stack_00000008;
  size_t totalsize;
  void *ptr;
  void *local_18;
  long local_10;
  void *local_8;
  
  if ((((((int)in_RDI[5] != 4) || (*(int *)((long)in_RDI + 0x2c) != in_ESI)) ||
       ((int)in_RDI[6] != in_EDX)) ||
      ((*(int *)((long)in_RDI + 0x34) != in_ECX || ((int)in_RDI[7] != in_R8D)))) ||
     ((in_RDI[2] != in_R9 || (((int)in_RDI[3] != in_stack_00000008 || (in_RDI[4] != totalsize))))))
  {
    if (in_RDI[1] != 0) {
      piVar1 = (int *)in_RDI[1];
      LOCK();
      iVar2 = *piVar1;
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (iVar2 == 1) {
        if (in_RDI[4] == 0) {
          local_8 = (void *)*in_RDI;
          if (local_8 != (void *)0x0) {
            free(local_8);
          }
        }
        else {
          (**(code **)(*(long *)in_RDI[4] + 0x18))((long *)in_RDI[4],*in_RDI);
        }
      }
    }
    *in_RDI = 0;
    in_RDI[2] = 0;
    *(undefined4 *)(in_RDI + 3) = 0;
    *(undefined4 *)(in_RDI + 5) = 0;
    *(undefined4 *)((long)in_RDI + 0x2c) = 0;
    *(undefined4 *)(in_RDI + 6) = 0;
    *(undefined4 *)((long)in_RDI + 0x34) = 0;
    *(undefined4 *)(in_RDI + 7) = 0;
    in_RDI[8] = 0;
    in_RDI[1] = 0;
    in_RDI[2] = in_R9;
    *(int *)(in_RDI + 3) = in_stack_00000008;
    in_RDI[4] = totalsize;
    *(undefined4 *)(in_RDI + 5) = 4;
    *(int *)((long)in_RDI + 0x2c) = in_ESI;
    *(int *)(in_RDI + 6) = in_EDX;
    *(int *)((long)in_RDI + 0x34) = in_ECX;
    *(int *)(in_RDI + 7) = in_R8D;
    in_RDI[8] = ((long)*(int *)((long)in_RDI + 0x2c) * (long)(int)in_RDI[6] *
                 (long)*(int *)((long)in_RDI + 0x34) * in_RDI[2] + 0xfU & 0xfffffffffffffff0) /
                (ulong)in_RDI[2];
    uVar3 = in_RDI[8] * (long)(int)in_RDI[7] * in_RDI[2] + 3U & 0xfffffffffffffffc;
    if (uVar3 != 0) {
      if (in_RDI[4] == 0) {
        local_10 = uVar3 + 4;
        local_18 = (void *)0x0;
        iVar2 = posix_memalign(&local_18,0x40,uVar3 + 0x44);
        if (iVar2 != 0) {
          local_18 = (void *)0x0;
        }
        *in_RDI = (long)local_18;
      }
      else {
        lVar4 = (**(code **)(*(long *)in_RDI[4] + 0x10))((long *)in_RDI[4],uVar3 + 4);
        *in_RDI = lVar4;
      }
    }
    if (*in_RDI != 0) {
      in_RDI[1] = *in_RDI + uVar3;
      *(undefined4 *)in_RDI[1] = 1;
    }
  }
  return;
}

Assistant:

void Mat::create(int _w, int _h, int _d, int _c, size_t _elemsize, int _elempack, Allocator* _allocator)
{
    if (dims == 4 && w == _w && h == _h && d == _d && c == _c && elemsize == _elemsize && elempack == _elempack && allocator == _allocator)
        return;

    release();

    elemsize = _elemsize;
    elempack = _elempack;
    allocator = _allocator;

    dims = 4;
    w = _w;
    h = _h;
    d = _d;
    c = _c;

    cstep = alignSize((size_t)w * h * d * elemsize, 16) / elemsize;

    size_t totalsize = alignSize(total() * elemsize, 4);
    if (totalsize > 0)
    {
        if (allocator)
            data = allocator->fastMalloc(totalsize + (int)sizeof(*refcount));
        else
            data = fastMalloc(totalsize + (int)sizeof(*refcount));
    }

    if (data)
    {
        refcount = (int*)(((unsigned char*)data) + totalsize);
        *refcount = 1;
    }
}